

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O1

void __thiscall HFactor::updatePF(HFactor *this,HVector *aq,HVector *ep,int iRow,int *hint)

{
  pointer piVar1;
  pointer pdVar2;
  iterator iVar3;
  iterator iVar4;
  HVector *pHVar5;
  int iVar6;
  double *__args;
  long lVar7;
  double value;
  int index;
  int local_5c;
  double local_58;
  HVector *local_50;
  int local_44;
  int *local_40;
  vector<int,std::allocator<int>> *local_38;
  
  iVar6 = aq->packCount;
  local_5c = iRow;
  local_50 = aq;
  local_40 = hint;
  if (0 < (long)iVar6) {
    piVar1 = (aq->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (aq->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_38 = (vector<int,std::allocator<int>> *)&this->PFindex;
    lVar7 = 0;
    do {
      local_44 = piVar1[lVar7];
      local_58 = pdVar2[lVar7];
      if (local_44 != local_5c) {
        iVar3._M_current =
             (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_38,iVar3,&local_44);
        }
        else {
          *iVar3._M_current = local_44;
          (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        iVar4._M_current =
             (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&this->PFvalue,iVar4,&local_58);
        }
        else {
          *iVar4._M_current = local_58;
          (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
      }
      lVar7 = lVar7 + 1;
    } while (iVar6 != lVar7);
  }
  iVar3._M_current =
       (this->PFpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->PFpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->PFpivotIndex,iVar3,&local_5c);
  }
  else {
    *iVar3._M_current = local_5c;
    (this->PFpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  pHVar5 = local_50;
  __args = (local_50->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + local_5c;
  iVar4._M_current =
       (this->PFpivotValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->PFpivotValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&this->PFpivotValue,iVar4,__args);
  }
  else {
    *iVar4._M_current = *__args;
    (this->PFpivotValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  iVar6 = (int)((ulong)((long)(this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  local_58 = (double)CONCAT44(local_58._4_4_,iVar6);
  iVar3._M_current =
       (this->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  if (iVar3._M_current ==
      (this->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&this->PFstart,iVar3,(int *)&local_58);
  }
  else {
    *iVar3._M_current = iVar6;
    (this->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current + 1;
  }
  iVar6 = this->UtotalX + pHVar5->packCount;
  this->UtotalX = iVar6;
  if (this->UmeritX < iVar6) {
    *local_40 = 1;
  }
  this->FtotalX = this->FtotalX + pHVar5->packCount;
  return;
}

Assistant:

void HFactor::updatePF(HVector *aq, HVector *ep, int iRow, int *hint) {
    // Check space
    const int columnCount = aq->packCount;
    const int *columnIndex = &aq->packIndex[0];
    const double *columnArray = &aq->packValue[0];

    // Copy the pivotal column
    for (int i = 0; i < columnCount; i++) {
        int index = columnIndex[i];
        double value = columnArray[i];
        if (index != iRow) {
            PFindex.push_back(index);
            PFvalue.push_back(value);
        }
    }

    // Save pivot
    PFpivotIndex.push_back(iRow);
    PFpivotValue.push_back(aq->array[iRow]);
    PFstart.push_back(PFindex.size());

    // Check refactor
    UtotalX += aq->packCount;
    if (UtotalX > UmeritX)
        *hint = 1;
    FtotalX += aq->packCount;
}